

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err mem_map(uc_engine *uc,MemoryRegion *block)

{
  int iVar1;
  MemoryRegion **ppMVar2;
  uc_err uVar3;
  
  uVar3 = UC_ERR_NOMEM;
  if (block != (MemoryRegion *)0x0) {
    if ((uc->mapped_block_count & 0x1f) == 0) {
      ppMVar2 = (MemoryRegion **)
                g_realloc(uc->mapped_blocks,(ulong)(uc->mapped_block_count + 0x20) << 3);
      if (ppMVar2 == (MemoryRegion **)0x0) {
        return UC_ERR_NOMEM;
      }
      uc->mapped_blocks = ppMVar2;
    }
    iVar1 = bsearch_mapped_blocks(uc,block->addr);
    memmove(uc->mapped_blocks + (long)iVar1 + 1,uc->mapped_blocks + iVar1,
            (ulong)(uc->mapped_block_count - iVar1) << 3);
    uc->mapped_blocks[iVar1] = block;
    uc->mapped_block_count = uc->mapped_block_count + 1;
    uVar3 = UC_ERR_OK;
  }
  return uVar3;
}

Assistant:

static uc_err mem_map(uc_engine *uc, MemoryRegion *block)
{

    MemoryRegion **regions;
    int pos;

    if (block == NULL) {
        return UC_ERR_NOMEM;
    }

    if ((uc->mapped_block_count & (MEM_BLOCK_INCR - 1)) == 0) { // time to grow
        regions = (MemoryRegion **)g_realloc(
            uc->mapped_blocks,
            sizeof(MemoryRegion *) * (uc->mapped_block_count + MEM_BLOCK_INCR));
        if (regions == NULL) {
            return UC_ERR_NOMEM;
        }
        uc->mapped_blocks = regions;
    }

    pos = bsearch_mapped_blocks(uc, block->addr);

    // shift the array right to give space for the new pointer
    memmove(&uc->mapped_blocks[pos + 1], &uc->mapped_blocks[pos],
            sizeof(MemoryRegion *) * (uc->mapped_block_count - pos));

    uc->mapped_blocks[pos] = block;
    uc->mapped_block_count++;

    return UC_ERR_OK;
}